

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

void exchange_bytes(void *a,void *b,size_t size)

{
  uint8_t uVar1;
  uint8_t t;
  uint8_t *bp;
  uint8_t *ap;
  size_t size_local;
  void *b_local;
  void *a_local;
  
  bp = (uint8_t *)b;
  ap = (uint8_t *)a;
  size_local = size;
  while (size_local != 0) {
    uVar1 = *ap;
    *ap = *bp;
    *bp = uVar1;
    bp = bp + 1;
    ap = ap + 1;
    size_local = size_local - 1;
  }
  return;
}

Assistant:

static void exchange_bytes(void *a, void *b, size_t size) {
    uint8_t *ap = (uint8_t *)a;
    uint8_t *bp = (uint8_t *)b;

    while (size-- != 0) {
        uint8_t t = *ap;
        *ap++ = *bp;
        *bp++ = t;
    }
}